

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O3

void __thiscall
cmCTestGlobalVC::DoRevision
          (cmCTestGlobalVC *this,Revision *revision,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  size_t *psVar1;
  cmCTest *this_00;
  _List_node_base *p_Var2;
  int iVar3;
  _Node *p_Var4;
  ostream *poVar5;
  char *__s;
  size_t sVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
  *this_01;
  mapped_type *pmVar7;
  Revision *pRVar8;
  pointer pCVar9;
  string name;
  ostringstream cmCTestLog_msg;
  string local_208;
  Revision *local_1e8;
  string local_1e0;
  Revision *local_1c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
  *local_1b8;
  pointer local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  sVar6 = (revision->Rev)._M_string_length;
  if (sVar6 == (this->OldRevision)._M_string_length) {
    if (sVar6 != 0) {
      iVar3 = bcmp((revision->Rev)._M_dataplus._M_p,(this->OldRevision)._M_dataplus._M_p,sVar6);
      if (iVar3 != 0) goto LAB_0021eaa1;
    }
    std::__cxx11::string::_M_assign((string *)&this->PriorRev);
    std::__cxx11::string::_M_assign((string *)&(this->PriorRev).Date);
    std::__cxx11::string::_M_assign((string *)&(this->PriorRev).Author);
    std::__cxx11::string::_M_assign((string *)&(this->PriorRev).EMail);
    std::__cxx11::string::_M_assign((string *)&(this->PriorRev).Committer);
    std::__cxx11::string::_M_assign((string *)&(this->PriorRev).CommitterEMail);
    std::__cxx11::string::_M_assign((string *)&(this->PriorRev).CommitDate);
    std::__cxx11::string::_M_assign((string *)&(this->PriorRev).Log);
    return;
  }
LAB_0021eaa1:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
  std::ostream::flush();
  this_00 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x23,local_208._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  p_Var4 = std::__cxx11::list<cmCTestVC::Revision,std::allocator<cmCTestVC::Revision>>::
           _M_create_node<cmCTestVC::Revision_const&>
                     ((list<cmCTestVC::Revision,std::allocator<cmCTestVC::Revision>> *)
                      &this->Revisions,revision);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  psVar1 = &(this->Revisions).
            super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (this->Revisions).
           super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
  poVar5 = (this->super_cmCTestVC).Log;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Found revision ",0xf);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)p_Var2[1]._M_next,(long)p_Var2[1]._M_prev);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  author = ",0xb);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)p_Var2[5]._M_next,(long)p_Var2[5]._M_prev);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  date = ",9);
  local_1e8 = (Revision *)p_Var2;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)p_Var2[3]._M_next,(long)p_Var2[3]._M_prev);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  pCVar9 = (changes->
           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_1b0 = (changes->
              super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar9 != local_1b0) {
    local_1e8 = (Revision *)((long)local_1e8 + 0x10);
    local_1b8 = &this->Dirs;
    local_1c0 = &this->PriorRev;
    do {
      iVar3 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[8])(this,&pCVar9->Path);
      __s = (char *)CONCAT44(extraout_var,iVar3);
      if (__s != (char *)0x0) {
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,__s,__s + sVar6);
        cmsys::SystemTools::GetFilenamePath(local_1a8,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,__s,__s + sVar6);
        cmsys::SystemTools::GetFilenameName(&local_208,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        this_01 = &std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
                   ::operator[](local_1b8,local_1a8)->
                   super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
        ;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
                 ::operator[](this_01,&local_208);
        pRVar8 = pmVar7->Rev;
        if (pmVar7->Rev == (Revision *)0x0) {
          pRVar8 = local_1c0;
        }
        pmVar7->PriorRev = pRVar8;
        pmVar7->Rev = local_1e8;
        poVar5 = (this->super_cmCTestVC).Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        local_1e0._M_dataplus._M_p._0_1_ = pCVar9->Action;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1e0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        sVar6 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
      }
      pCVar9 = pCVar9 + 1;
    } while (pCVar9 != local_1b0);
  }
  return;
}

Assistant:

void cmCTestGlobalVC::DoRevision(Revision const& revision,
                                 std::vector<Change> const& changes)
{
  // Ignore changes in the old revision.
  if (revision.Rev == this->OldRevision) {
    this->PriorRev = revision;
    return;
  }

  // Indicate we found a revision.
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Store the revision.
  this->Revisions.push_back(revision);

  // Report this revision.
  Revision const& rev = this->Revisions.back();
  /* clang-format off */
  this->Log << "Found revision " << rev.Rev << "\n"
            << "  author = " << rev.Author << "\n"
            << "  date = " << rev.Date << "\n";
  /* clang-format on */

  // Update information about revisions of the changed files.
  for (Change const& c : changes) {
    if (const char* local = this->LocalPath(c.Path)) {
      std::string dir = cmSystemTools::GetFilenamePath(local);
      std::string name = cmSystemTools::GetFilenameName(local);
      File& file = this->Dirs[dir][name];
      file.PriorRev = file.Rev ? file.Rev : &this->PriorRev;
      file.Rev = &rev;
      this->Log << "  " << c.Action << " " << local << " "
                << "\n";
    }
  }
}